

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_shift_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int iVar1;
  TCGv_i32 pTVar2;
  ea_what what;
  TCGv_i32 ea_result;
  TCGv_i32 addr;
  TCGv_i32 src;
  int left;
  int logical;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  _left = s->uc->tcg_ctx;
  src._4_4_ = insn & 8;
  src._0_4_ = insn & 0x100;
  what = EA_LOADU;
  if ((insn & 8) == 0) {
    what = EA_LOADS;
  }
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  addr = gen_ea(env,s,insn,1,_left->NULL_QREG,&ea_result,what,
                (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (addr == _left->NULL_QREG) {
    gen_addr_fault(pDStack_18);
  }
  else {
    tcg_gen_movi_i32(_left,QREG_CC_V,0);
    if ((uint)src == 0) {
      tcg_gen_mov_i32(_left,QREG_CC_C,addr);
      if (src._4_4_ == 0) {
        tcg_gen_sari_i32_m68k(_left,QREG_CC_N,addr,1);
      }
      else {
        tcg_gen_shri_i32_m68k(_left,QREG_CC_N,addr,1);
      }
    }
    else {
      tcg_gen_shri_i32_m68k(_left,QREG_CC_C,addr,0xf);
      tcg_gen_shli_i32_m68k(_left,QREG_CC_N,addr,1);
      if ((src._4_4_ == 0) && (iVar1 = m68k_feature(pDStack_18->env,0), iVar1 != 0)) {
        addr = gen_extend(pDStack_18,addr,1,1);
        tcg_gen_xor_i32(_left,QREG_CC_V,QREG_CC_N,addr);
      }
    }
    gen_ext(_left,QREG_CC_N,QREG_CC_N,1,1);
    tcg_gen_andi_i32_m68k(_left,QREG_CC_C,QREG_CC_C,1);
    tcg_gen_mov_i32(_left,QREG_CC_Z,QREG_CC_N);
    tcg_gen_mov_i32(_left,QREG_CC_X,QREG_CC_C);
    pTVar2 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,1,QREG_CC_N,&ea_result
                    ,EA_STORE,(uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar2 == _left->NULL_QREG) {
      gen_addr_fault(pDStack_18);
    }
    else {
      set_cc_op(pDStack_18,CC_OP_FLAGS);
    }
  }
  return;
}

Assistant:

DISAS_INSN(shift_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int logical = insn & 8;
    int left = insn & 0x100;
    TCGv src;
    TCGv addr;

    SRC_EA(env, src, OS_WORD, !logical, &addr);
    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
    if (left) {
        tcg_gen_shri_i32(tcg_ctx, QREG_CC_C, src, 15);
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, 1);

        /*
         * Note that ColdFire always clears V,
         * while M68000 sets if the most significant bit is changed at
         * any time during the shift operation
         */
        if (!logical && m68k_feature(s->env, M68K_FEATURE_M68000)) {
            src = gen_extend(s, src, OS_WORD, 1);
            tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_N, src);
        }
    } else {
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, src);
        if (logical) {
            tcg_gen_shri_i32(tcg_ctx, QREG_CC_N, src, 1);
        } else {
            tcg_gen_sari_i32(tcg_ctx, QREG_CC_N, src, 1);
        }
    }

    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, OS_WORD, 1);
    tcg_gen_andi_i32(tcg_ctx, QREG_CC_C, QREG_CC_C, 1);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_X, QREG_CC_C);

    DEST_EA(env, insn, OS_WORD, QREG_CC_N, &addr);
    set_cc_op(s, CC_OP_FLAGS);
}